

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O3

void __thiscall TadsMessageQueue::flush(TadsMessageQueue *this)

{
  OS_Counter *pOVar1;
  TadsMessage *pTVar2;
  TadsMessage *pTVar3;
  OS_Mutex *pOVar4;
  
  pOVar4 = this->mu;
  while( true ) {
    pthread_mutex_lock((pthread_mutex_t *)&pOVar4->h);
    pTVar2 = this->head;
    if (pTVar2 == (TadsMessage *)0x0) break;
    pTVar3 = pTVar2->nxt;
    this->head = pTVar3;
    if (pTVar3 == (TadsMessage *)0x0) {
      this->tail = (TadsMessage *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mu->h);
    LOCK();
    pOVar1 = &(pTVar2->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pTVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(pTVar2);
    }
    pOVar4 = this->mu;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mu->h);
  return;
}

Assistant:

void flush()
    {
        /* keep going until the queue is empty */
        for (;;)
        {
            /* lock the queue, and pull the first element off the list */
            mu->lock();
            TadsMessage *m = head;

            /* if we got an element, unlink it */
            if (m != 0)
            {
                head = m->nxt;
                if (head == 0)
                    tail = 0;
            }

            /* unlock the queue */
            mu->unlock();

            /* if we're out of queue elements, we're done */
            if (m == 0)
                break;

            /* release this message */
            m->release_ref();
        }
    }